

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

char * helicsBrokerGetIdentifier(HelicsBroker broker)

{
  int iVar1;
  Broker *pBVar2;
  undefined4 extraout_var;
  char *pcVar3;
  
  pBVar2 = getBroker(broker,(HelicsError *)0x0);
  if (pBVar2 == (Broker *)0x0) {
    pcVar3 = "";
  }
  else {
    iVar1 = (*pBVar2->_vptr_Broker[0xb])(pBVar2);
    pcVar3 = *(char **)CONCAT44(extraout_var,iVar1);
  }
  return pcVar3;
}

Assistant:

const char* helicsBrokerGetIdentifier(HelicsBroker broker)
{
    auto* brk = getBroker(broker, nullptr);
    if (brk == nullptr) {
        return nullstrPtr;
    }
    const auto& ident = brk->getIdentifier();
    return ident.c_str();
}